

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

cmFileList * __thiscall cmFileList::operator/(cmFileList *this,cmFileListGeneratorBase *rhs)

{
  _Head_base<0UL,_cmFileListGeneratorBase_*,_false> _Var1;
  cmFileListGeneratorBase *in_RAX;
  cmFileListGeneratorBase *pcVar2;
  pointer *__ptr;
  _Head_base<0UL,_cmFileListGeneratorBase_*,_false> local_18;
  
  if (this->Last == (cmFileListGeneratorBase *)0x0) {
    local_18._M_head_impl = in_RAX;
    (*rhs->_vptr_cmFileListGeneratorBase[3])(&local_18);
    _Var1._M_head_impl = local_18._M_head_impl;
    local_18._M_head_impl = (cmFileListGeneratorBase *)0x0;
    pcVar2 = (this->First)._M_t.
             super___uniq_ptr_impl<cmFileListGeneratorBase,_std::default_delete<cmFileListGeneratorBase>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmFileListGeneratorBase_*,_std::default_delete<cmFileListGeneratorBase>_>
             .super__Head_base<0UL,_cmFileListGeneratorBase_*,_false>._M_head_impl;
    (this->First)._M_t.
    super___uniq_ptr_impl<cmFileListGeneratorBase,_std::default_delete<cmFileListGeneratorBase>_>.
    _M_t.
    super__Tuple_impl<0UL,_cmFileListGeneratorBase_*,_std::default_delete<cmFileListGeneratorBase>_>
    .super__Head_base<0UL,_cmFileListGeneratorBase_*,_false>._M_head_impl = _Var1._M_head_impl;
    if (pcVar2 != (cmFileListGeneratorBase *)0x0) {
      (*pcVar2->_vptr_cmFileListGeneratorBase[1])();
    }
    if (local_18._M_head_impl != (cmFileListGeneratorBase *)0x0) {
      (*(local_18._M_head_impl)->_vptr_cmFileListGeneratorBase[1])();
    }
    pcVar2 = (this->First)._M_t.
             super___uniq_ptr_impl<cmFileListGeneratorBase,_std::default_delete<cmFileListGeneratorBase>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmFileListGeneratorBase_*,_std::default_delete<cmFileListGeneratorBase>_>
             .super__Head_base<0UL,_cmFileListGeneratorBase_*,_false>._M_head_impl;
  }
  else {
    pcVar2 = cmFileListGeneratorBase::SetNext(this->Last,rhs);
  }
  this->Last = pcVar2;
  return this;
}

Assistant:

cmFileList& operator/(cmFileListGeneratorBase const& rhs)
  {
    if (this->Last) {
      this->Last = this->Last->SetNext(rhs);
    } else {
      this->First = rhs.Clone();
      this->Last = this->First.get();
    }
    return *this;
  }